

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_certificate_request
              (ptls_t *tls,st_ptls_certificate_request_t *cr,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  st_ptls_certificate_request_t *psVar4;
  int iVar5;
  void *pvVar6;
  uint8_t *end_00;
  uint8_t *puVar7;
  uint8_t *p;
  ptls_iovec_t pVar8;
  uint8_t local_d0 [8];
  uint8_t *local_c8;
  size_t local_c0;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  st_ptls_extension_bitmap_t bitmap;
  size_t len;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint16_t exttype;
  uint8_t *puStack_28;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_certificate_request_t *cr_local;
  ptls_t *tls_local;
  
  _block_size = 1;
  if (end == src) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    end_local = src;
    do {
      puVar7 = end_local + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end_local;
      _block_size = _block_size - 1;
      end_local = puVar7;
    } while (_block_size != 0);
    _capacity._2_2_ = 0;
    if ((ulong)((long)end - (long)puVar7) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else {
      bitmap.bits = (uint8_t  [8])((long)(puVar7 + _block_size64) - (long)puVar7);
      if ((ulong)bitmap.bits < 0x100) {
        local_d0 = bitmap.bits;
        if (bitmap.bits == (uint8_t  [8])0x0) {
          local_d0[0] = '\x01';
          local_d0[1] = '\0';
          local_d0[2] = '\0';
          local_d0[3] = '\0';
          local_d0[4] = '\0';
          local_d0[5] = '\0';
          local_d0[6] = '\0';
          local_d0[7] = '\0';
        }
        puStack_28 = end;
        src_local = (uint8_t *)cr;
        cr_local = (st_ptls_certificate_request_t *)tls;
        pvVar6 = malloc((size_t)local_d0);
        *(void **)src_local = pvVar6;
        if (pvVar6 == (void *)0x0) {
          _capacity._4_4_ = 0x201;
        }
        else {
          *(uint8_t (*) [8])(src_local + 8) = bitmap.bits;
          memcpy(*(void **)src_local,end_local,(size_t)bitmap.bits);
          end_local = puVar7 + _block_size64;
          init_extension_bitmap((st_ptls_extension_bitmap_t *)&_capacity_1,'\r');
          _block_size_1 = 2;
          if ((ulong)((long)puStack_28 - (long)end_local) < 2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            _block_size64_1 = 0;
            do {
              puVar7 = end_local + 1;
              _block_size64_1 = _block_size64_1 << 8 | (ulong)*end_local;
              _block_size_1 = _block_size_1 - 1;
              end_local = puVar7;
            } while (_block_size_1 != 0);
            if ((ulong)((long)puStack_28 - (long)puVar7) < _block_size64_1) {
              _capacity._4_4_ = 0x32;
            }
            else {
              end_00 = puVar7 + _block_size64_1;
              while (end_local = puVar7, end_local != end_00) {
                _capacity._4_4_ =
                     ptls_decode16((uint16_t *)((long)&_capacity + 2),&end_local,end_00);
                if (_capacity._4_4_ != 0) {
                  return _capacity._4_4_;
                }
                iVar5 = extension_bitmap_is_set
                                  ((st_ptls_extension_bitmap_t *)&_capacity_1,_capacity._2_2_);
                if (iVar5 != 0) {
                  return 0x2f;
                }
                extension_bitmap_set((st_ptls_extension_bitmap_t *)&_capacity_1,_capacity._2_2_);
                psVar4 = cr_local;
                uVar3 = _capacity._2_2_;
                _block_size_2 = 2;
                if ((ulong)((long)end_00 - (long)end_local) < 2) {
                  return 0x32;
                }
                _block_size64_2 = 0;
                do {
                  p = end_local + 1;
                  _block_size64_2 = _block_size64_2 << 8 | (ulong)*end_local;
                  _block_size_2 = _block_size_2 - 1;
                  end_local = p;
                } while (_block_size_2 != 0);
                if ((ulong)((long)end_00 - (long)p) < _block_size64_2) {
                  return 0x32;
                }
                puVar7 = p + _block_size64_2;
                if (*(long *)((cr_local->context).base + 0xb0) != 0) {
                  pcVar1 = (code *)**(undefined8 **)((cr_local->context).base + 0xb0);
                  uVar2 = *(undefined8 *)((cr_local->context).base + 0xb0);
                  pVar8 = ptls_iovec_init(p,(long)puVar7 - (long)p);
                  local_c8 = pVar8.base;
                  local_c0 = pVar8.len;
                  iVar5 = (*pcVar1)(uVar2,psVar4,0xd,uVar3,local_c8,local_c0);
                  _capacity._4_4_ = (uint)(iVar5 != 0);
                  if (iVar5 != 0) {
                    return _capacity._4_4_;
                  }
                }
                if (_capacity._2_2_ == 0xd) {
                  iVar5 = decode_signature_algorithms
                                    ((st_ptls_signature_algorithms_t *)(src_local + 0x10),&end_local
                                     ,puVar7);
                  if (iVar5 != 0) {
                    return iVar5;
                  }
                  _capacity._4_4_ = 0;
                }
              }
              if (end_local == end_00) {
                if (end_local == puStack_28) {
                  if (*(long *)(src_local + 0x30) == 0) {
                    _capacity._4_4_ = 0x6d;
                  }
                  else {
                    _capacity._4_4_ = 0;
                  }
                }
                else {
                  _capacity._4_4_ = 0x32;
                }
              }
              else {
                _capacity._4_4_ = 0x32;
              }
            }
          }
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int decode_certificate_request(ptls_t *tls, struct st_ptls_certificate_request_t *cr, const uint8_t *src,
                                      const uint8_t *const end)
{
    int ret;
    uint16_t exttype = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        size_t len = end - src;
        if (len > 255) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((cr->context.base = malloc(len != 0 ? len : 1)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        cr->context.len = len;
        memcpy(cr->context.base, src, len);
        src = end;
    });

    /* decode extensions */
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&cr->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        }
        src = end;
    });

    if (cr->signature_algorithms.count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}